

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O3

int zbuild_huffman(zhuffman *z,uint8 *sizelist,int num)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  byte bVar9;
  ushort uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  uint16 uVar19;
  long lVar20;
  long lVar21;
  int iVar23;
  undefined1 auVar22 [16];
  int iVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  int iVar39;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  int iVar40;
  int iVar42;
  undefined1 auVar41 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar45 [16];
  int sizes [17];
  int next_code [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined4 local_88;
  int aiStack_78 [18];
  
  local_98 = (undefined1  [16])0x0;
  local_a8 = (undefined1  [16])0x0;
  local_b8 = (undefined1  [16])0x0;
  local_c8 = (undefined1  [16])0x0;
  local_88 = 0;
  memset(z,0xff,0x400);
  if (0 < num) {
    uVar13 = 0;
    do {
      *(int *)(local_c8 + (ulong)sizelist[uVar13] * 4) =
           *(int *)(local_c8 + (ulong)sizelist[uVar13] * 4) + 1;
      uVar13 = uVar13 + 1;
    } while ((uint)num != uVar13);
  }
  lVar14 = 1;
  do {
    if (1 << ((byte)lVar14 & 0x1f) < *(int *)(local_c8 + lVar14 * 4)) {
      __assert_fail("sizes[i] <= (1 << i)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/meruiden[P]CS3D/external/soil/src/stb_image_aug.c"
                    ,0x673,"int zbuild_huffman(zhuffman *, uint8 *, int)");
    }
    lVar14 = lVar14 + 1;
  } while (lVar14 != 0x10);
  lVar14 = 0;
  bVar9 = 0xf;
  iVar15 = 0;
  iVar18 = 0;
  while( true ) {
    aiStack_78[lVar14 + 1] = iVar15;
    z->firstcode[lVar14 + 1] = (uint16)iVar15;
    z->firstsymbol[lVar14 + 1] = (uint16)iVar18;
    iVar23 = *(int *)(local_c8 + lVar14 * 4 + 4);
    iVar15 = iVar15 + iVar23;
    if ((iVar23 != 0) && (1 << ((char)lVar14 + 1U & 0x1f) < iVar15)) break;
    z->maxcode[lVar14 + 1] = iVar15 << (bVar9 & 0x1f);
    iVar15 = iVar15 * 2;
    iVar18 = iVar18 + iVar23;
    bVar9 = bVar9 - 1;
    lVar14 = lVar14 + 1;
    if (lVar14 == 0xf) {
      z->maxcode[0x10] = 0x10000;
      auVar8 = _DAT_00220a20;
      auVar7 = _DAT_00220a10;
      auVar6 = _DAT_00220a00;
      auVar5 = _DAT_001fda10;
      auVar4 = _DAT_001fc020;
      if (0 < num) {
        uVar13 = 0;
        do {
          bVar9 = sizelist[uVar13];
          if (bVar9 != 0) {
            iVar15 = aiStack_78[bVar9];
            lVar14 = (ulong)z->firstsymbol[bVar9] + ((long)iVar15 - (ulong)z->firstcode[bVar9]);
            *(byte *)((long)z + lVar14 + 0x484) = bVar9;
            *(short *)((long)z + lVar14 * 2 + 0x5a4) = (short)uVar13;
            if ((bVar9 < 10) &&
               (uVar10 = (ushort)iVar15 << 8 | (ushort)iVar15 >> 8,
               uVar11 = (uVar10 & 0xf0f) << 4 | uVar10 >> 4 & 0xf0f,
               uVar11 = (uVar11 >> 2 & 0x3333) + (uVar11 & 0x3333) * 4,
               uVar11 = (uVar11 >> 1 & 0x5555) + (uVar11 & 0x5555) * 2 >> (0x10 - bVar9 & 0x1f),
               uVar11 < 0x200)) {
              lVar20 = 1L << (bVar9 & 0x3f);
              uVar12 = (ulong)uVar11 + lVar20;
              uVar16 = (ulong)(uVar12 < 0x200);
              uVar17 = 0x200;
              if (0x200 < uVar12) {
                uVar17 = uVar12;
              }
              uVar12 = (uVar17 - uVar16) - uVar12 >> (bVar9 & 0x3f);
              lVar21 = uVar16 + uVar12;
              auVar22._8_4_ = (int)lVar21;
              auVar22._0_8_ = lVar21;
              auVar22._12_4_ = (int)((ulong)lVar21 >> 0x20);
              auVar22 = auVar22 ^ auVar4;
              uVar17 = 0;
              do {
                lVar21 = (uVar17 << (bVar9 & 0x3f)) + (ulong)uVar11;
                auVar34._8_4_ = (int)uVar17;
                auVar34._0_8_ = uVar17;
                auVar34._12_4_ = (int)(uVar17 >> 0x20);
                auVar26 = (auVar34 | auVar5) ^ auVar4;
                iVar18 = auVar22._0_4_;
                iVar40 = -(uint)(iVar18 < auVar26._0_4_);
                iVar23 = auVar22._4_4_;
                auVar27._4_4_ = -(uint)(iVar23 < auVar26._4_4_);
                iVar39 = auVar22._8_4_;
                iVar42 = -(uint)(iVar39 < auVar26._8_4_);
                iVar24 = auVar22._12_4_;
                auVar27._12_4_ = -(uint)(iVar24 < auVar26._12_4_);
                auVar36._4_4_ = iVar40;
                auVar36._0_4_ = iVar40;
                auVar36._8_4_ = iVar42;
                auVar36._12_4_ = iVar42;
                auVar43 = pshuflw(in_XMM11,auVar36,0xe8);
                auVar29._4_4_ = -(uint)(auVar26._4_4_ == iVar23);
                auVar29._12_4_ = -(uint)(auVar26._12_4_ == iVar24);
                auVar29._0_4_ = auVar29._4_4_;
                auVar29._8_4_ = auVar29._12_4_;
                auVar45 = pshuflw(in_XMM12,auVar29,0xe8);
                auVar27._0_4_ = auVar27._4_4_;
                auVar27._8_4_ = auVar27._12_4_;
                auVar44 = pshuflw(auVar43,auVar27,0xe8);
                auVar26._8_4_ = 0xffffffff;
                auVar26._0_8_ = 0xffffffffffffffff;
                auVar26._12_4_ = 0xffffffff;
                auVar26 = (auVar44 | auVar45 & auVar43) ^ auVar26;
                auVar26 = packssdw(auVar26,auVar26);
                uVar19 = (uint16)lVar14;
                if ((auVar26 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  z->fast[lVar21] = uVar19;
                }
                auVar27 = auVar29 & auVar36 | auVar27;
                auVar26 = packssdw(auVar27,auVar27);
                auVar44._8_4_ = 0xffffffff;
                auVar44._0_8_ = 0xffffffffffffffff;
                auVar44._12_4_ = 0xffffffff;
                auVar26 = packssdw(auVar26 ^ auVar44,auVar26 ^ auVar44);
                if ((auVar26._0_4_ >> 0x10 & 1) != 0) {
                  z->fast[lVar21 + lVar20] = uVar19;
                }
                auVar26 = (auVar34 | auVar8) ^ auVar4;
                iVar40 = -(uint)(iVar18 < auVar26._0_4_);
                auVar41._4_4_ = -(uint)(iVar23 < auVar26._4_4_);
                iVar42 = -(uint)(iVar39 < auVar26._8_4_);
                auVar41._12_4_ = -(uint)(iVar24 < auVar26._12_4_);
                auVar28._4_4_ = iVar40;
                auVar28._0_4_ = iVar40;
                auVar28._8_4_ = iVar42;
                auVar28._12_4_ = iVar42;
                auVar35._4_4_ = -(uint)(auVar26._4_4_ == iVar23);
                auVar35._12_4_ = -(uint)(auVar26._12_4_ == iVar24);
                auVar35._0_4_ = auVar35._4_4_;
                auVar35._8_4_ = auVar35._12_4_;
                auVar41._0_4_ = auVar41._4_4_;
                auVar41._8_4_ = auVar41._12_4_;
                auVar26 = auVar35 & auVar28 | auVar41;
                auVar26 = packssdw(auVar26,auVar26);
                auVar1._8_4_ = 0xffffffff;
                auVar1._0_8_ = 0xffffffffffffffff;
                auVar1._12_4_ = 0xffffffff;
                auVar26 = packssdw(auVar26 ^ auVar1,auVar26 ^ auVar1);
                if ((auVar26 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  z->fast[lVar20 * 2 + lVar21] = uVar19;
                }
                auVar29 = pshufhw(auVar28,auVar28,0x84);
                auVar36 = pshufhw(auVar35,auVar35,0x84);
                auVar27 = pshufhw(auVar29,auVar41,0x84);
                auVar30._8_4_ = 0xffffffff;
                auVar30._0_8_ = 0xffffffffffffffff;
                auVar30._12_4_ = 0xffffffff;
                auVar30 = (auVar27 | auVar36 & auVar29) ^ auVar30;
                auVar29 = packssdw(auVar30,auVar30);
                if ((auVar29 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  z->fast[lVar21 + (3L << (bVar9 & 0x3f))] = uVar19;
                }
                auVar29 = (auVar34 | auVar7) ^ auVar4;
                iVar40 = -(uint)(iVar18 < auVar29._0_4_);
                auVar32._4_4_ = -(uint)(iVar23 < auVar29._4_4_);
                iVar42 = -(uint)(iVar39 < auVar29._8_4_);
                auVar32._12_4_ = -(uint)(iVar24 < auVar29._12_4_);
                auVar37._4_4_ = iVar40;
                auVar37._0_4_ = iVar40;
                auVar37._8_4_ = iVar42;
                auVar37._12_4_ = iVar42;
                auVar26 = pshuflw(auVar26,auVar37,0xe8);
                auVar31._4_4_ = -(uint)(auVar29._4_4_ == iVar23);
                auVar31._12_4_ = -(uint)(auVar29._12_4_ == iVar24);
                auVar31._0_4_ = auVar31._4_4_;
                auVar31._8_4_ = auVar31._12_4_;
                in_XMM12 = pshuflw(auVar45 & auVar43,auVar31,0xe8);
                in_XMM12 = in_XMM12 & auVar26;
                auVar32._0_4_ = auVar32._4_4_;
                auVar32._8_4_ = auVar32._12_4_;
                auVar26 = pshuflw(auVar26,auVar32,0xe8);
                auVar43._8_4_ = 0xffffffff;
                auVar43._0_8_ = 0xffffffffffffffff;
                auVar43._12_4_ = 0xffffffff;
                auVar43 = (auVar26 | in_XMM12) ^ auVar43;
                in_XMM11 = packssdw(auVar43,auVar43);
                if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  z->fast[lVar21 + lVar20 * 4] = uVar19;
                }
                auVar32 = auVar31 & auVar37 | auVar32;
                auVar26 = packssdw(auVar32,auVar32);
                auVar45._8_4_ = 0xffffffff;
                auVar45._0_8_ = 0xffffffffffffffff;
                auVar45._12_4_ = 0xffffffff;
                auVar26 = packssdw(auVar26 ^ auVar45,auVar26 ^ auVar45);
                if ((auVar26 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  z->fast[lVar21 + (5L << (bVar9 & 0x3f))] = uVar19;
                }
                auVar26 = (auVar34 | auVar6) ^ auVar4;
                iVar18 = -(uint)(iVar18 < auVar26._0_4_);
                auVar38._4_4_ = -(uint)(iVar23 < auVar26._4_4_);
                iVar39 = -(uint)(iVar39 < auVar26._8_4_);
                auVar38._12_4_ = -(uint)(iVar24 < auVar26._12_4_);
                auVar33._4_4_ = iVar18;
                auVar33._0_4_ = iVar18;
                auVar33._8_4_ = iVar39;
                auVar33._12_4_ = iVar39;
                auVar25._4_4_ = -(uint)(auVar26._4_4_ == iVar23);
                auVar25._12_4_ = -(uint)(auVar26._12_4_ == iVar24);
                auVar25._0_4_ = auVar25._4_4_;
                auVar25._8_4_ = auVar25._12_4_;
                auVar38._0_4_ = auVar38._4_4_;
                auVar38._8_4_ = auVar38._12_4_;
                auVar26 = auVar25 & auVar33 | auVar38;
                auVar26 = packssdw(auVar26,auVar26);
                auVar2._8_4_ = 0xffffffff;
                auVar2._0_8_ = 0xffffffffffffffff;
                auVar2._12_4_ = 0xffffffff;
                auVar26 = packssdw(auVar26 ^ auVar2,auVar26 ^ auVar2);
                if ((auVar26 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  z->fast[lVar21 + (6L << (bVar9 & 0x3f))] = uVar19;
                }
                auVar34 = pshufhw(auVar33,auVar33,0x84);
                auVar26 = pshufhw(auVar25,auVar25,0x84);
                auVar29 = pshufhw(auVar34,auVar38,0x84);
                auVar3._8_4_ = 0xffffffff;
                auVar3._0_8_ = 0xffffffffffffffff;
                auVar3._12_4_ = 0xffffffff;
                auVar26 = packssdw(auVar26 & auVar34,(auVar29 | auVar26 & auVar34) ^ auVar3);
                if ((auVar26 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  z->fast[lVar21 + (7L << (bVar9 & 0x3f))] = uVar19;
                }
                uVar17 = uVar17 + 8;
              } while ((uVar16 + uVar12 + 8 & 0xfffffffffffffff8) != uVar17);
            }
            aiStack_78[bVar9] = iVar15 + 1;
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != (uint)num);
      }
      return 1;
    }
  }
  failure_reason = "Corrupt JPEG";
  return 0;
}

Assistant:

static int zbuild_huffman(zhuffman *z, uint8 *sizelist, int num)
{
   int i,k=0;
   int code, next_code[16], sizes[17];

   // DEFLATE spec for generating codes
   memset(sizes, 0, sizeof(sizes));
   memset(z->fast, 255, sizeof(z->fast));
   for (i=0; i < num; ++i)
      ++sizes[sizelist[i]];
   sizes[0] = 0;
   for (i=1; i < 16; ++i)
      assert(sizes[i] <= (1 << i));
   code = 0;
   for (i=1; i < 16; ++i) {
      next_code[i] = code;
      z->firstcode[i] = (uint16) code;
      z->firstsymbol[i] = (uint16) k;
      code = (code + sizes[i]);
      if (sizes[i])
         if (code-1 >= (1 << i)) return e("bad codelengths","Corrupt JPEG");
      z->maxcode[i] = code << (16-i); // preshift for inner loop
      code <<= 1;
      k += sizes[i];
   }
   z->maxcode[16] = 0x10000; // sentinel
   for (i=0; i < num; ++i) {
      int s = sizelist[i];
      if (s) {
         int c = next_code[s] - z->firstcode[s] + z->firstsymbol[s];
         z->size[c] = (uint8)s;
         z->value[c] = (uint16)i;
         if (s <= ZFAST_BITS) {
            int k = bit_reverse(next_code[s],s);
            while (k < (1 << ZFAST_BITS)) {
               z->fast[k] = (uint16) c;
               k += (1 << s);
            }
         }
         ++next_code[s];
      }
   }
   return 1;
}